

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryMappedFile.cpp
# Opt level: O0

int __thiscall MemoryMappedFile::close(MemoryMappedFile *this,int __fd)

{
  int iVar1;
  int *piVar2;
  bool bVar3;
  Log local_c0;
  String local_b0;
  Log local_90;
  Log local_80;
  int local_70;
  int ret;
  Log local_60;
  String local_50;
  Log local_30;
  Log local_20;
  MemoryMappedFile *local_10;
  MemoryMappedFile *this_local;
  
  local_10 = this;
  if ((this->mpMapped != (void *)0x0) &&
     (iVar1 = munmap(this->mpMapped,this->mFileSize), iVar1 != 0)) {
    ::error();
    Log::operator<<((Log *)&local_50,(char *)&local_60);
    ::operator<<((Log *)&local_50.mString.field_2,&local_50);
    Log::operator<<(&local_30,local_50.mString.field_2._M_local_buf);
    __errno_location();
    Log::operator<<(&local_20,(int32_t)&local_30);
    Log::~Log(&local_20);
    Log::~Log(&local_30);
    Log::~Log((Log *)&local_50.mString.field_2);
    Log::~Log((Log *)&local_50);
    Log::~Log(&local_60);
  }
  if (this->mFd != -1) {
    do {
      local_70 = ::close(this->mFd);
      bVar3 = false;
      if (local_70 == -1) {
        piVar2 = __errno_location();
        bVar3 = *piVar2 == 4;
      }
    } while (bVar3);
    if (local_70 == -1) {
      ::error();
      Log::operator<<((Log *)&local_b0,(char *)&local_c0);
      ::operator<<((Log *)&local_b0.mString.field_2,&local_b0);
      Log::operator<<(&local_90,local_b0.mString.field_2._M_local_buf);
      __errno_location();
      Log::operator<<(&local_80,(int32_t)&local_90);
      Log::~Log(&local_80);
      Log::~Log(&local_90);
      Log::~Log((Log *)&local_b0.mString.field_2);
      Log::~Log((Log *)&local_b0);
      Log::~Log(&local_c0);
    }
    this->mFd = -1;
  }
  this->mFileSize = 0;
  String::clear(&(this->mFilename).super_String);
  this->mpMapped = (void *)0x0;
  this->mAccessType = NO_ACCESS;
  return (int)this;
}

Assistant:

void MemoryMappedFile::close()
{
#ifdef _WIN32
    if(mpMapped && !UnmapViewOfFile(mpMapped))
    {
        error() << "Could not UnmapViewOfFile(). GetLastError()="
                << GetLastError();
    }
    closeHandleIfValid(mhFileMapping);
    closeHandleIfValid(mhFile);

#else  // ifdef _WIN32
    if(mpMapped != nullptr && munmap(mpMapped, mFileSize) != 0)
    {
        error() << "Could not unmap " << mFilename
                << ". errno=" << errno;
    }

    if(mFd != -1)
    {
        int ret;
        eintrwrap(ret, ::close(mFd));

        if(ret == -1)
        {
            error() << "Could not close file " << mFilename
                    << ". errno=" << errno;
        }

        mFd = -1;
    }

#endif

    mFileSize = 0;
    mFilename.clear();
    mpMapped = nullptr;
    mAccessType = NO_ACCESS;
}